

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O3

pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> * __thiscall
PhyloTree::leaf_difference
          (pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,PhyloTree *this,PhyloTree *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> vStack_60;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  __first1 = (this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  __last1 = (this->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __first2 = (other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (other->leaf2NumMap).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = __return_storage_ptr__;
  pbVar4 = __first2;
  pbVar3 = __first1;
  if ((long)__last1 - (long)__first1 == (long)pbVar6 - (long)__first2) {
    bVar1 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                      (__first1,__last1,__first2);
    if (bVar1) {
      (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    __first1 = (this->leaf2NumMap).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (this->leaf2NumMap).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (other->leaf2NumMap).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = __first2;
    pbVar3 = __first1;
  }
joined_r0x0012355a:
  while( true ) {
    if ((__first1 == __last1) || (__first2 == pbVar6)) {
      local_38 = pbVar4;
      if (__first1 != __last1) {
        uVar5 = (long)__first1 - (long)pbVar3;
        do {
          local_7c = (int)(uVar5 >> 5);
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_7c);
          }
          else {
            *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_7c;
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          __first1 = __first1 + 1;
          uVar5 = uVar5 + 0x20;
        } while (__first1 != __last1);
      }
      if (__first2 != pbVar6) {
        uVar5 = (long)__first2 - (long)local_38;
        do {
          local_7c = (int)(uVar5 >> 5);
          if (vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&vStack_60,
                       (iterator)
                       vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_7c);
          }
          else {
            *vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_7c;
            vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          __first2 = __first2 + 1;
          uVar5 = uVar5 + 0x20;
        } while (__first2 != pbVar6);
      }
      (local_40->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      (local_40->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      (local_40->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      (local_40->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      (local_40->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      (local_40->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      return local_40;
    }
    iVar2 = std::__cxx11::string::compare((string *)__first1);
    if (-1 < iVar2) break;
    local_7c = (int)((ulong)((long)__first1 - (long)pbVar3) >> 5);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_78,
                 (iterator)
                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_7c);
    }
    else {
      *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_7c;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    __first1 = __first1 + 1;
  }
  __n = __first1->_M_string_length;
  if ((__n != __first2->_M_string_length) ||
     ((__n != 0 &&
      (iVar2 = bcmp((__first1->_M_dataplus)._M_p,(__first2->_M_dataplus)._M_p,__n), iVar2 != 0))))
  goto LAB_001235a2;
  __first1 = __first1 + 1;
  goto LAB_00123629;
LAB_001235a2:
  iVar2 = std::__cxx11::string::compare((string *)__first2);
  if (iVar2 < 0) {
    local_7c = (int)((ulong)((long)__first2 - (long)pbVar4) >> 5);
    if (vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&vStack_60,
                 (iterator)
                 vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_7c);
    }
    else {
      *vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_7c;
      vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = vStack_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
LAB_00123629:
    __first2 = __first2 + 1;
  }
  goto joined_r0x0012355a;
}

Assistant:

std::pair<std::vector<int>, std::vector<int>> PhyloTree::leaf_difference(const PhyloTree& other) {
    std::pair<std::vector<int>, std::vector<int>> out;
    if (this->leaf2NumMap == other.leaf2NumMap) {
        return std::move(out);
    }

    auto beg1 = this->leaf2NumMap.begin();
    auto beg2 = other.leaf2NumMap.begin();
    auto end1 = this->leaf2NumMap.end();
    auto end2 = other.leaf2NumMap.end();
    auto o1 = std::back_inserter(out.first);
    auto o2 = std::back_inserter(out.second);
    auto front1 = beg1;
    auto front2 = beg2;

    while (beg1 != end1 && beg2 != end2) {
        if ((*beg1) < (*beg2)) {
            (*o1++) = std::distance(front1, beg1++);
        }
        else if ((*beg1) == (*beg2)) {
            beg1++;
            beg2++;
        }
        else if ((*beg2) < (*beg1)) {
            (*o2++) = std::distance(front2, beg2++);
        }
    }

    while (beg1 != end1) {
        (*o1++) = std::distance(front1, beg1++);
    }

    while (beg2 != end2) {
        (*o2++) = std::distance(front2, beg2++);
    }
    return std::move(out);
}